

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_count_shift.hpp
# Opt level: O0

void __thiscall trng::lcg64_count_shift::split(lcg64_count_shift *this,uint s,uint n)

{
  result_type rVar1;
  undefined8 extraout_RAX;
  uint in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  double __x;
  double in_XMM1_Qa;
  invalid_argument *this_00;
  lcg64_count_shift *in_stack_ffffffffffffffd0;
  result_type in_stack_ffffffffffffffd8;
  lcg64_count_shift *in_stack_ffffffffffffffe0;
  
  if ((in_ESI == 0) || (in_ESI <= in_EDX)) {
    this_00 = (invalid_argument *)&stack0xffffffffffffffe0;
    std::invalid_argument::invalid_argument
              (this_00,"invalid argument for trng::lcg64_count_shift::split");
    utility::throw_this<std::invalid_argument>(this_00);
    std::invalid_argument::~invalid_argument((invalid_argument *)&stack0xffffffffffffffe0);
  }
  if (1 < in_ESI) {
    jump(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    rVar1 = f(in_stack_ffffffffffffffd8,(result_type)in_stack_ffffffffffffffd0);
    in_RDI[1] = rVar1 * in_RDI[1];
    pow(__x,in_XMM1_Qa);
    *in_RDI = extraout_RAX;
    rVar1 = mult_modulo((result_type)in_stack_ffffffffffffffd0,(result_type)in_RDI);
    in_RDI[2] = rVar1;
    backward(in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64_count_shift::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(
          std::invalid_argument("invalid argument for trng::lcg64_count_shift::split"));
#endif
    if (s > 1) {
      // LCG part
      jump(n + 1ull);
      P.b *= f(s, P.a);
      P.a = pow(P.a, s);
      // counting part
      P.inc = mult_modulo(s, P.inc);
      backward();
    }
  }